

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_550beb::PointerToMemberType::printLeft(PointerToMemberType *this,OutputStream *s)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  byte bVar5;
  char cVar6;
  
  (*this->MemberType->_vptr_Node[4])();
  pNVar1 = this->MemberType;
  if (pNVar1->ArrayCache == Unknown) {
    iVar4 = (*pNVar1->_vptr_Node[1])(pNVar1,s);
    cVar6 = (char)iVar4;
  }
  else {
    cVar6 = pNVar1->ArrayCache == Yes;
  }
  bVar5 = 0x28;
  if (cVar6 == '\0') {
    pNVar1 = this->MemberType;
    if (pNVar1->FunctionCache == Unknown) {
      iVar4 = (*pNVar1->_vptr_Node[2])(pNVar1,s);
      cVar6 = (char)iVar4;
    }
    else {
      cVar6 = pNVar1->FunctionCache == Yes;
    }
    bVar5 = cVar6 << 3 | 0x20;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = bVar5;
  s->CurrentPosition = s->CurrentPosition + 1;
  pNVar1 = this->ClassType;
  (*pNVar1->_vptr_Node[4])(pNVar1,s);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,s);
  }
  OutputStream::grow(s,3);
  pcVar2 = s->Buffer;
  sVar3 = s->CurrentPosition;
  pcVar2[sVar3 + 2] = '*';
  pcVar2 = pcVar2 + sVar3;
  pcVar2[0] = ':';
  pcVar2[1] = ':';
  s->CurrentPosition = s->CurrentPosition + 3;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    MemberType->printLeft(s);
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += "(";
    else
      s += " ";
    ClassType->print(s);
    s += "::*";
  }